

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvf.inc.c
# Opt level: O2

_Bool trans_flw(DisasContext_conflict11 *ctx,arg_flw *a)

{
  TCGContext_conflict9 *tcg_ctx;
  _Bool _Var1;
  TCGv_i32 t;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i32(tcg_ctx);
  gen_get_gpr(tcg_ctx,t,a->rs1);
  if ((ctx->mstatus_fs == 0) || ((ctx->misa & 0x20) == 0)) {
    _Var1 = false;
  }
  else {
    tcg_gen_addi_i32_riscv32(tcg_ctx,t,t,a->imm);
    tcg_gen_qemu_ld_i64_riscv32(tcg_ctx,tcg_ctx->cpu_fpr[a->rd],t,(ulong)ctx->mem_idx,MO_32);
    tcg_gen_ori_i64_riscv32(tcg_ctx,tcg_ctx->cpu_fpr[a->rd],tcg_ctx->cpu_fpr[a->rd],-0x100000000);
    tcg_temp_free_internal_riscv32(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
    mark_fs_dirty(ctx);
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

static bool trans_flw(DisasContext *ctx, arg_flw *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, t0, a->rs1);
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVF);
    tcg_gen_addi_tl(tcg_ctx, t0, t0, a->imm);

    tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], t0, ctx->mem_idx, MO_TEUL);
    /* RISC-V requires NaN-boxing of narrower width floating point values */
    tcg_gen_ori_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_fpr[a->rd], 0xffffffff00000000ULL);

    tcg_temp_free(tcg_ctx, t0);
    mark_fs_dirty(ctx);
    return true;
}